

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.inl
# Opt level: O1

uint32_t __thiscall
bits::detail::
RadixSort<8U,_unsigned_int,_unsigned_int,_bits::detail::FloatFlip,_bits::detail::InvFloatFlip>::
operator()(RadixSort<8U,_unsigned_int,_unsigned_int,_bits::detail::FloatFlip,_bits::detail::InvFloatFlip>
           *this,uint *keys_in,uint *keys_temp,uint *values_in,uint *values_temp,uint32_t size)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint *puVar11;
  long lVar12;
  ulong uVar13;
  uint *values [2];
  uint *keys [2];
  uint32_t sum [4];
  uint32_t hist [4] [256];
  uint *local_1088 [6];
  uint *local_1058;
  uint *local_1050;
  uint auStack_1048 [4];
  uint local_1038 [768];
  uint auStack_438 [258];
  
  uVar4 = (ulong)size;
  memset(local_1038,0,0x1000);
  if (size != 0) {
    uVar9 = 0;
    do {
      uVar5 = keys_in[uVar9];
      lVar6 = 0;
      puVar7 = local_1038;
      do {
        puVar7[(((int)uVar5 >> 0x1f | 0x80000000U) ^ uVar5) >> ((byte)lVar6 & 0x1f) & 0xff] =
             puVar7[(((int)uVar5 >> 0x1f | 0x80000000U) ^ uVar5) >> ((byte)lVar6 & 0x1f) & 0xff] + 1
        ;
        lVar6 = lVar6 + 8;
        puVar7 = puVar7 + 0x100;
      } while (lVar6 != 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar4);
  }
  puVar7 = local_1038;
  lVar6 = 0;
  do {
    auStack_1048[lVar6] = *puVar7;
    *puVar7 = 0;
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 0x100;
  } while (lVar6 != 4);
  lVar6 = 1;
  puVar7 = local_1038;
  do {
    puVar7 = puVar7 + 1;
    lVar12 = 0;
    puVar11 = puVar7;
    do {
      uVar5 = auStack_1048[lVar12];
      uVar8 = *puVar11;
      *puVar11 = uVar5;
      auStack_1048[lVar12] = uVar8 + uVar5;
      lVar12 = lVar12 + 1;
      puVar11 = puVar11 + 0x100;
    } while (lVar12 != 4);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  local_1088[2] = keys_in;
  local_1088[3] = keys_temp;
  local_1088[0] = values_in;
  local_1088[1] = values_temp;
  if (size != 0) {
    uVar9 = 0;
    do {
      uVar10 = ((int)keys_in[uVar9] >> 0x1f | 0x80000000U) ^ keys_in[uVar9];
      uVar8 = uVar10 & 0xff;
      uVar5 = local_1038[uVar8];
      local_1038[uVar8] = uVar5 + 1;
      keys_temp[uVar5] = uVar10;
      values_temp[uVar5] = values_in[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  local_1088[5] = keys_temp;
  local_1058 = values_in;
  local_1050 = values_temp;
  lVar6 = 1;
  do {
    if (size != 0) {
      uVar5 = (uint)lVar6 & 1;
      uVar9 = (ulong)(uVar5 << 3);
      uVar13 = (ulong)((uVar5 ^ 1) << 3);
      lVar12 = *(long *)((long)local_1088 + uVar9 + 0x10);
      lVar1 = *(long *)((long)local_1088 + uVar13 + 0x10);
      lVar2 = *(long *)((long)local_1088 + uVar9);
      lVar3 = *(long *)((long)local_1088 + uVar13);
      uVar9 = 0;
      do {
        uVar5 = *(uint *)(lVar12 + uVar9 * 4);
        uVar13 = (ulong)(uVar5 >> ((char)lVar6 * '\b' & 0x1fU) & 0xff);
        uVar8 = local_1038[lVar6 * 0x100 + uVar13];
        local_1038[lVar6 * 0x100 + uVar13] = uVar8 + 1;
        *(uint *)(lVar1 + (ulong)uVar8 * 4) = uVar5;
        *(undefined4 *)(lVar3 + (ulong)uVar8 * 4) = *(undefined4 *)(lVar2 + uVar9 * 4);
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  if (size != 0) {
    uVar9 = 0;
    do {
      uVar5 = keys_temp[uVar9];
      uVar8 = auStack_438[uVar5 >> 0x18];
      auStack_438[uVar5 >> 0x18] = uVar8 + 1;
      keys_in[uVar8] = (0xffffffffU - ((int)uVar5 >> 0x1f) | 0x80000000) ^ uVar5;
      values_in[uVar8] = values_temp[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  return 0;
}

Assistant:

uint32_t operator()(KeyType* __restrict keys_in,
        KeyType* __restrict keys_temp, ValueType* __restrict values_in,
        ValueType* __restrict values_temp, uint32_t size) const
    {
        DecodeOp decode_op;
        EncodeOp encode_op;
        PassThrough pass_through;

        // Initialise each histogram bucket with the key value
        uint32_t hist[kHistBuckets][kHistSize] = {0};
        for (uint32_t i = 0; i < size; ++i)
        {
            const KeyType key = decode_op(keys_in[i]);
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                const uint32_t shift = bucket * kRadixBits;
                const uint32_t pos = (key >> shift) & kHistMask;
                ++hist[bucket][pos];
            }
        }

        // Update the histogram data so each entry sums the previous entries
        uint32_t sum[kHistBuckets];
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            sum[bucket] = hist[bucket][0];
            hist[bucket][0] = 0;
        }

        uint32_t tsum;
        for (uint32_t i = 1; i < kHistSize; ++i)
        {
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                tsum = hist[bucket][i] + sum[bucket];
                hist[bucket][i] = sum[bucket];
                sum[bucket] = tsum;
            }
        }

        // alternate input and output buffers on each radix pass
        KeyType* __restrict keys[2] = {keys_in, keys_temp};
        ValueType* __restrict values[2] = {values_in, values_temp};

        uint32_t out = 0;

        {
            // decode key on first radix pass
            const uint32_t bucket = 0;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, decode_op, pass_through);
        }

        for (uint32_t bucket = 1; bucket < kHistBuckets - 1; ++bucket)
        {
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, pass_through);
        }

        {
            // encode key on last radix pass
            const uint32_t bucket = kHistBuckets - 1;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, encode_op);
        }

        return out;
    }